

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

char * getAuthTypeStringForJson(IOTHUB_REGISTRYMANAGER_AUTH_METHOD authMethod)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  char *authTypeForJson;
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD authMethod_local;
  
  if (authMethod == IOTHUB_REGISTRYMANAGER_AUTH_SPK) {
    l = (LOGGER_LOG)DEVICE_JSON_KEY_DEVICE_AUTH_SAS;
  }
  else if (authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT) {
    l = (LOGGER_LOG)DEVICE_JSON_KEY_DEVICE_AUTH_SELF_SIGNED;
  }
  else if (authMethod == IOTHUB_REGISTRYMANAGER_AUTH_X509_CERTIFICATE_AUTHORITY) {
    l = (LOGGER_LOG)DEVICE_JSON_KEY_DEVICE_AUTH_CERTIFICATE_AUTHORITY;
  }
  else if (authMethod == IOTHUB_REGISTRYMANAGER_AUTH_NONE) {
    l = (LOGGER_LOG)DEVICE_JSON_KEY_DEVICE_AUTH_NONE;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"getAuthTypeStringForJson",0x1a9,1,"Cannot map <%d> to auth type for JSON string",
                authMethod);
    }
    l = (LOGGER_LOG)0x0;
  }
  return (char *)l;
}

Assistant:

static const char *getAuthTypeStringForJson(IOTHUB_REGISTRYMANAGER_AUTH_METHOD authMethod)
{
    const char *authTypeForJson;

    if (IOTHUB_REGISTRYMANAGER_AUTH_SPK == authMethod)
    {
        authTypeForJson = DEVICE_JSON_KEY_DEVICE_AUTH_SAS;
    }
    else if (IOTHUB_REGISTRYMANAGER_AUTH_X509_THUMBPRINT == authMethod)
    {
        authTypeForJson = DEVICE_JSON_KEY_DEVICE_AUTH_SELF_SIGNED;
    }
    else if (IOTHUB_REGISTRYMANAGER_AUTH_X509_CERTIFICATE_AUTHORITY == authMethod)
    {
        authTypeForJson = DEVICE_JSON_KEY_DEVICE_AUTH_CERTIFICATE_AUTHORITY;
    }
    else if (IOTHUB_REGISTRYMANAGER_AUTH_NONE == authMethod)
    {
        authTypeForJson = DEVICE_JSON_KEY_DEVICE_AUTH_NONE;
    }
    else
    {
        LogError("Cannot map <%d> to auth type for JSON string", authMethod);
        authTypeForJson = NULL;
    }

    return authTypeForJson;
}